

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

void __thiscall
TPZFMatrix<long_double>::TPZFMatrix
          (TPZFMatrix<long_double> *this,void **vtt,int64_t rows,int64_t columns)

{
  longdouble *plVar1;
  ulong uVar2;
  
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[3];
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[2];
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[1];
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = rows;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = columns;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)*vtt;
  this->fElem = (longdouble *)0x0;
  this->fGiven = (longdouble *)0x0;
  this->fSize = 0;
  TPZVec<int>::TPZVec(&(this->fPivot).super_TPZVec<int>,0);
  (this->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fPivot).super_TPZVec<int>.fStore = (this->fPivot).fExtAlloc;
  (this->fPivot).super_TPZVec<int>.fNElements = 0;
  (this->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  (this->fWork).fStore = (longdouble *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  uVar2 = columns * rows;
  if (uVar2 != 0) {
    plVar1 = (longdouble *)operator_new__(-(ulong)(uVar2 >> 0x3c != 0) | uVar2 * 0x10);
    this->fElem = plVar1;
  }
  return;
}

Assistant:

explicit inline  TPZFMatrix(const int64_t rows ,const int64_t columns = 1) : 
    TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId),
    TPZMatrix<TVar>(rows,columns), fElem(0),fGiven(0),fSize(0) {
        if(rows*columns) fElem = new TVar[rows*columns];
    }